

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

void yang_free_deviate(ly_ctx *ctx,lys_deviation *dev,uint index)

{
  uint local_24;
  uint local_20;
  uint j;
  uint i;
  uint index_local;
  lys_deviation *dev_local;
  ly_ctx *ctx_local;
  
  for (local_20 = index; local_20 < dev->deviate_size; local_20 = local_20 + 1) {
    lydict_remove(ctx,dev->deviate[local_20].units);
    if (dev->deviate[local_20].type != (lys_type *)0x0) {
      yang_type_free(ctx,dev->deviate[local_20].type);
    }
    for (local_24 = 0; local_24 < dev->deviate[local_20].dflt_size; local_24 = local_24 + 1) {
      lydict_remove(ctx,dev->deviate[local_20].dflt[local_24]);
    }
    free(dev->deviate[local_20].dflt);
    for (local_24 = 0; local_24 < dev->deviate[local_20].must_size; local_24 = local_24 + 1) {
      lys_restr_free(ctx,dev->deviate[local_20].must + local_24);
    }
    free(dev->deviate[local_20].must);
    for (local_24 = 0; local_24 < dev->deviate[local_20].unique_size; local_24 = local_24 + 1) {
      free(dev->deviate[local_20].unique[local_24].expr);
    }
    free(dev->deviate[local_20].unique);
    lys_extension_instances_free
              (ctx,dev->deviate[local_20].ext,(uint)dev->deviate[local_20].ext_size);
  }
  return;
}

Assistant:

static void
yang_free_deviate(struct ly_ctx *ctx, struct lys_deviation *dev, uint index)
{
    uint i, j;

    for (i = index; i < dev->deviate_size; ++i) {
        lydict_remove(ctx, dev->deviate[i].units);

        if (dev->deviate[i].type) {
            yang_type_free(ctx, dev->deviate[i].type);
        }

        for (j = 0; j < dev->deviate[i].dflt_size; ++j) {
            lydict_remove(ctx, dev->deviate[i].dflt[j]);
        }
        free(dev->deviate[i].dflt);

        for (j = 0; j < dev->deviate[i].must_size; ++j) {
            lys_restr_free(ctx, &dev->deviate[i].must[j]);
        }
        free(dev->deviate[i].must);

        for (j = 0; j < dev->deviate[i].unique_size; ++j) {
            free(dev->deviate[i].unique[j].expr);
        }
        free(dev->deviate[i].unique);
        lys_extension_instances_free(ctx, dev->deviate[i].ext, dev->deviate[i].ext_size);
    }
}